

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_set_new_window_title(char *title)

{
  thread_local_state *ptVar1;
  size_t sVar2;
  size_t sVar3;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    sVar2 = strlen(title);
    sVar3 = 0xff;
    if (sVar2 < 0xff) {
      sVar3 = sVar2;
    }
    _al_sane_strncpy(ptVar1->new_window_title,title,sVar3 + 1);
    return;
  }
  return;
}

Assistant:

void al_set_new_window_title(const char *title)
{
   thread_local_state *tls;
   size_t size;

   if ((tls = tls_get()) == NULL)
      return;

   size = strlen(title);

   if (size > ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE) {
      size = ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE;
   }

   _al_sane_strncpy(tls->new_window_title, title, size + 1);
}